

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

void __thiscall irr::scene::CSceneManager::clearDeletionList(CSceneManager *this)

{
  bool bVar1;
  u32 uVar2;
  ISceneNode **ppIVar3;
  u32 i;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar4;
  uint uVar5;
  
  bVar1 = core::array<irr::scene::ISceneNode_*>::empty((array<irr::scene::ISceneNode_*> *)0x2f9f2f);
  if (!bVar1) {
    uVar4 = 0;
    while (uVar5 = uVar4,
          uVar2 = core::array<irr::scene::ISceneNode_*>::size
                            ((array<irr::scene::ISceneNode_*> *)0x2f9f5b), uVar4 < uVar2) {
      ppIVar3 = core::array<irr::scene::ISceneNode_*>::operator[]
                          ((array<irr::scene::ISceneNode_*> *)
                           CONCAT44(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
      (*(*ppIVar3)->_vptr_ISceneNode[0x14])();
      core::array<irr::scene::ISceneNode_*>::operator[]
                ((array<irr::scene::ISceneNode_*> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
      uVar4 = uVar5 + 1;
    }
    core::array<irr::scene::ISceneNode_*>::clear
              ((array<irr::scene::ISceneNode_*> *)CONCAT44(uVar5,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void CSceneManager::clearDeletionList()
{
	if (DeletionList.empty())
		return;

	for (u32 i = 0; i < DeletionList.size(); ++i) {
		DeletionList[i]->remove();
		DeletionList[i]->drop();
	}

	DeletionList.clear();
}